

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBOCache.cpp
# Opt level: O1

GLFrameBufferObj * __thiscall
Diligent::FBOCache::GetFBO(FBOCache *this,Uint32 Width,Uint32 Height,GLContextState *ContextState)

{
  __int_type_conflict _Var1;
  long lVar2;
  _Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
  _Var3;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>,_bool>
  pVar4;
  GLFrameBufferObj NewFBO;
  string msg;
  FBOCacheKey Key;
  GLFrameBufferObj local_20c;
  string local_1f8;
  key_type local_1d8;
  
  local_1d8.RTIds[3] = 0;
  local_1d8.RTIds[4] = 0;
  local_1d8.RTIds[5] = 0;
  local_1d8.RTIds[6] = 0;
  local_1d8.NumRenderTargets = 0;
  local_1d8.RTIds[0] = 0;
  local_1d8.RTIds[1] = 0;
  local_1d8.RTIds[2] = 0;
  local_1d8.RTIds[7] = 0;
  lVar2 = 0x28;
  do {
    *(undefined8 *)((long)local_1d8.RTIds + lVar2 + 0xc) = 0;
    *(undefined8 *)((long)local_1d8.RTIds + lVar2 + 0x14) = 0;
    *(undefined8 *)((long)local_1d8.RTIds + lVar2 + -4) = 0;
    *(undefined8 *)((long)local_1d8.RTIds + lVar2 + 4) = 0;
    *(undefined2 *)((long)local_1d8.RTIds + lVar2 + 0x1c) = 0;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x168);
  local_1d8.DSId = 0;
  local_1d8.DSVDesc.super_DeviceObjectAttribs.Name = (Char *)0x0;
  local_1d8.DSVDesc.ViewType = TEXTURE_VIEW_UNDEFINED;
  local_1d8.DSVDesc.TextureDim = RESOURCE_DIM_UNDEFINED;
  local_1d8.DSVDesc.Format = TEX_FORMAT_UNKNOWN;
  local_1d8.DSVDesc.MostDetailedMip = 0;
  local_1d8.DSVDesc.NumMipLevels = 0;
  local_1d8.DSVDesc.field_5 = (anon_union_4_2_fd7742d7_for_TextureViewDesc_6)0x0;
  local_1d8.DSVDesc.field_6 = (anon_union_4_2_468fdb0b_for_TextureViewDesc_8)0x0;
  local_1d8.DSVDesc.AccessFlags = UAV_ACCESS_UNSPECIFIED;
  local_1d8.DSVDesc.Flags = TEXTURE_VIEW_FLAG_NONE;
  local_1d8.DSVDesc.Swizzle.R = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  local_1d8.DSVDesc.Swizzle.G = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  local_1d8.DSVDesc.Swizzle.B = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  local_1d8.DSVDesc.Swizzle.A = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  local_1d8.Hash = 0;
  local_1d8.Height = Height;
  local_1d8.Width = Width;
  while( true ) {
    LOCK();
    _Var1 = (this->m_CacheLock).m_IsLocked._M_base._M_i;
    (this->m_CacheLock).m_IsLocked._M_base._M_i = true;
    UNLOCK();
    if ((_Var1 & 1U) == 0) break;
    Threading::SpinLock::Wait(&this->m_CacheLock);
  }
  _Var3._M_cur = (__node_type *)
                 std::
                 _Hashtable<Diligent::FBOCache::FBOCacheKey,_std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_std::allocator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FBOCache::FBOCacheKey>,_Diligent::FBOCache::FBOCacheKeyHashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->m_Cache)._M_h,&local_1d8);
  if (_Var3._M_cur == (__node_type *)0x0) {
    CreateFBO(&local_20c,ContextState,0,(TextureViewGLImpl **)0x0,(TextureViewGLImpl *)0x0,Width,
              Height);
    pVar4 = std::
            _Hashtable<Diligent::FBOCache::FBOCacheKey,std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>,std::__detail::_Select1st,std::equal_to<Diligent::FBOCache::FBOCacheKey>,Diligent::FBOCache::FBOCacheKeyHashFunc,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<Diligent::FBOCache::FBOCacheKey&,GLObjectWrappers::GLFrameBufferObj>
                      ((_Hashtable<Diligent::FBOCache::FBOCacheKey,std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>,std::__detail::_Select1st,std::equal_to<Diligent::FBOCache::FBOCacheKey>,Diligent::FBOCache::FBOCacheKeyHashFunc,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->m_Cache,&local_1d8,&local_20c);
    _Var3._M_cur = (__node_type *)
                   pVar4.first.
                   super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                   ._M_cur;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[25]>(&local_1f8,(char (*) [25])"New FBO was not inserted");
      DebugAssertionFailed
                (local_1f8._M_dataplus._M_p,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x13a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
              (&local_20c.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
  }
  Threading::SpinLock::unlock(&this->m_CacheLock);
  return (GLFrameBufferObj *)
         ((long)&((_Var3._M_cur)->
                 super__Hash_node_value<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>
                 ._M_storage._M_storage + 0x1a8);
}

Assistant:

const GLObjectWrappers::GLFrameBufferObj& FBOCache::GetFBO(Uint32 Width, Uint32 Height, GLContextState& ContextState)
{
    FBOCacheKey Key;
    Key.Width  = Width;
    Key.Height = Height;

    // Lock the cache
    Threading::SpinLockGuard CacheGuard{m_CacheLock};

    // Try to find FBO in the map
    auto fbo_it = m_Cache.find(Key);
    if (fbo_it == m_Cache.end())
    {
        // Create a new FBO
        GLObjectWrappers::GLFrameBufferObj NewFBO = CreateFBO(ContextState, 0, nullptr, nullptr, Width, Height);

        auto it_inserted = m_Cache.emplace(Key, std::move(NewFBO));
        // New FBO must be actually inserted
        VERIFY(it_inserted.second, "New FBO was not inserted");
        fbo_it = it_inserted.first;
    }
    return fbo_it->second;
}